

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O1

void Gia_ManTestDoms(Gia_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  long lVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  
  Gia_ManCleanMark1(p);
  pVVar4 = p->vCis;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar3 = 0;
    do {
      if ((int)uVar5 <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[lVar3];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar2].field_0x7;
      *puVar1 = *puVar1 | 0x40;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vCis;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar3 < (long)(uVar5 - (long)p->nRegs));
  }
  if (p->vDoms == (Vec_Int_t *)0x0) {
    Gia_ManComputeDoms(p);
    pVVar4 = Gia_ManCollectDoms(p);
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (int *)0x0;
    }
    if (pVVar4 != (Vec_Int_t *)0x0) {
      free(pVVar4);
    }
    Gia_ManCleanMark1(p);
    return;
  }
  __assert_fail("p->vDoms == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                ,0x127,"void Gia_ManTestDoms(Gia_Man_t *)");
}

Assistant:

void Gia_ManTestDoms( Gia_Man_t * p )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pObj;
    int i;
    // mark PIs
//    Gia_ManCreateRefs( p );
    Gia_ManCleanMark1( p );
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark1 = 1;
    // compute dominators
    assert( p->vDoms == NULL );
    vNodes = Gia_ManComputePiDoms( p );
//    printf( "Nodes = %d. Doms = %d.\n", Gia_ManAndNum(p), Vec_IntSize(vNodes) );
    Vec_IntFree( vNodes );
    // unmark PIs
    Gia_ManCleanMark1( p );
}